

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QMakeParser::ParseCtx>::reserve(QList<QMakeParser::ParseCtx> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QMakeParser::ParseCtx> *pQVar3;
  qsizetype qVar4;
  ParseCtx *b;
  Data *pDVar5;
  long in_RSI;
  QArrayDataPointer<QMakeParser::ParseCtx> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QMakeParser::ParseCtx> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QMakeParser::ParseCtx> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QMakeParser::ParseCtx> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QPodArrayOps<QMakeParser::ParseCtx> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QMakeParser::ParseCtx> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QArrayDataPointer<QMakeParser::ParseCtx> *)
           capacity((QList<QMakeParser::ParseCtx> *)0x3127af);
  qVar4 = QArrayDataPointer<QMakeParser::ParseCtx>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar3 - qVar4) {
    QArrayDataPointer<QMakeParser::ParseCtx>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QMakeParser::ParseCtx>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_00312952;
    QArrayDataPointer<QMakeParser::ParseCtx>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QMakeParser::ParseCtx>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QMakeParser::ParseCtx>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QMakeParser::ParseCtx>::setFlag
                ((QArrayDataPointer<QMakeParser::ParseCtx> *)0x312856,(ArrayOptions)f.i);
      goto LAB_00312952;
    }
  }
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (ParseCtx *)0xaaaaaaaaaaaaaaaa;
  local_38.size = -0x5555555555555556;
  local_40 = size((QList<QMakeParser::ParseCtx> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QMakeParser::ParseCtx>::QArrayDataPointer
            (pQVar3,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar3 = (QArrayDataPointer<QMakeParser::ParseCtx> *)
           QArrayDataPointer<QMakeParser::ParseCtx>::operator->(&local_38);
  QArrayDataPointer<QMakeParser::ParseCtx>::operator->(in_RDI);
  b = QArrayDataPointer<QMakeParser::ParseCtx>::begin
                ((QArrayDataPointer<QMakeParser::ParseCtx> *)0x3128d6);
  QArrayDataPointer<QMakeParser::ParseCtx>::operator->(in_RDI);
  QArrayDataPointer<QMakeParser::ParseCtx>::end(pQVar3);
  QtPrivate::QPodArrayOps<QMakeParser::ParseCtx>::copyAppend
            (in_stack_ffffffffffffff90,b,(ParseCtx *)pQVar3);
  pDVar5 = QArrayDataPointer<QMakeParser::ParseCtx>::d_ptr(&local_38);
  if (pDVar5 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QMakeParser::ParseCtx> *)
         QArrayDataPointer<QMakeParser::ParseCtx>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar3,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QMakeParser::ParseCtx>::setFlag
              ((QArrayDataPointer<QMakeParser::ParseCtx> *)0x312939,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QMakeParser::ParseCtx>::swap(pQVar3,in_stack_ffffffffffffff78);
  QArrayDataPointer<QMakeParser::ParseCtx>::~QArrayDataPointer(pQVar3);
LAB_00312952:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}